

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread-posix.c
# Opt level: O0

ppointer p_uthread_get_local(PUThreadKey *key)

{
  pthread_key_t *ppVar1;
  pthread_key_t *tls_key;
  PUThreadKey *key_local;
  
  if (key == (PUThreadKey *)0x0) {
    key_local = (PUThreadKey *)0x0;
  }
  else {
    ppVar1 = pp_uthread_get_tls_key(key);
    if (ppVar1 == (pthread_key_t *)0x0) {
      key_local = (PUThreadKey *)0x0;
    }
    else {
      key_local = (PUThreadKey *)pthread_getspecific(*ppVar1);
    }
  }
  return key_local;
}

Assistant:

P_LIB_API ppointer
p_uthread_get_local (PUThreadKey *key)
{
	pthread_key_t	*tls_key;
#ifdef P_OS_SCO
	ppointer	value;
#endif

	if (P_UNLIKELY (key == NULL))
		return NULL;

	if (P_UNLIKELY ((tls_key = pp_uthread_get_tls_key (key)) == NULL))
		return NULL;

#ifdef P_OS_SCO
	if (P_UNLIKELY (pthread_getspecific (*tls_key, &value) != 0))
		return NULL;

	return value;
#else
	return pthread_getspecific (*tls_key);
#endif
}